

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLutmin.c
# Opt level: O0

int Abc_ObjCheckAbsorb(Abc_Obj_t *pObj,Abc_Obj_t *pPivot,int nLutSize,Vec_Ptr_t *vFanins)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_3c;
  int i;
  Abc_Obj_t *pFanin;
  Vec_Ptr_t *vFanins_local;
  int nLutSize_local;
  Abc_Obj_t *pPivot_local;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_ObjIsNode(pObj);
  if ((iVar1 != 0) && (iVar1 = Abc_ObjIsNode(pPivot), iVar1 != 0)) {
    Vec_PtrClear(vFanins);
    for (local_3c = 0; iVar1 = Abc_ObjFaninNum(pObj), local_3c < iVar1; local_3c = local_3c + 1) {
      pAVar2 = Abc_ObjFanin(pObj,local_3c);
      if (pAVar2 != pPivot) {
        Vec_PtrPush(vFanins,pAVar2);
      }
    }
    local_3c = 0;
    while( true ) {
      iVar1 = Abc_ObjFaninNum(pPivot);
      if (iVar1 <= local_3c) {
        return 1;
      }
      pAVar2 = Abc_ObjFanin(pPivot,local_3c);
      Vec_PtrPushUnique(vFanins,pAVar2);
      iVar1 = Vec_PtrSize(vFanins);
      if (nLutSize < iVar1) break;
      local_3c = local_3c + 1;
    }
    return 0;
  }
  __assert_fail("Abc_ObjIsNode(pObj) && Abc_ObjIsNode(pPivot)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLutmin.c"
                ,0x3d,"int Abc_ObjCheckAbsorb(Abc_Obj_t *, Abc_Obj_t *, int, Vec_Ptr_t *)");
}

Assistant:

int Abc_ObjCheckAbsorb( Abc_Obj_t * pObj, Abc_Obj_t * pPivot, int nLutSize, Vec_Ptr_t * vFanins )
{
    Abc_Obj_t * pFanin;
    int i;
    assert( Abc_ObjIsNode(pObj) && Abc_ObjIsNode(pPivot) );
    // add fanins of the node
    Vec_PtrClear( vFanins );
    Abc_ObjForEachFanin( pObj, pFanin, i )
        if ( pFanin != pPivot )
            Vec_PtrPush( vFanins, pFanin );
    // add fanins of the fanin
    Abc_ObjForEachFanin( pPivot, pFanin, i )
    {
        Vec_PtrPushUnique( vFanins, pFanin );
        if ( Vec_PtrSize(vFanins) > nLutSize )
            return 0;
    }
    return 1;
}